

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

void connect_and_write(uv_connect_t *req,int status)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_buf_t buf;
  int status_local;
  uv_connect_t *req_local;
  
  buf.len._4_4_ = status;
  _eval_a = uv_buf_init(buffer,0x7fff);
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
            ,0x56,"req","==","&connect_req",req,"==",&connect_req);
    abort();
  }
  if ((long)buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
            ,0x57,"status","==","0",(long)buf.len._4_4_,"==",0);
    abort();
  }
  uv_write(&write_req,connect_req.handle,(uv_buf_t *)&eval_a,1,write_cb);
  connect_cb_called = connect_cb_called + 1;
  return;
}

Assistant:

static void connect_and_write(uv_connect_t* req, int status) {
  uv_buf_t buf = uv_buf_init(buffer, sizeof buffer);
  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);
  uv_write(&write_req, req->handle, &buf, 1, write_cb);
  connect_cb_called++;
}